

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_b44.c
# Opt level: O0

exr_result_t
uncompress_b44_impl(exr_decode_pipeline_t *decode,void *compressed_data,uint64_t comp_buf_size,
                   void *uncompressed_data,uint64_t uncomp_buf_size)

{
  int iVar1;
  long lVar2;
  long lVar3;
  void *in_RCX;
  ulong in_RDX;
  uint8_t *in_RSI;
  long *in_RDI;
  ulong in_R8;
  exr_coding_channel_info_t *curc_1;
  int c_1;
  int cury;
  int y_1;
  int x;
  int y;
  exr_coding_channel_info_t *curc;
  int c;
  uint16_t s [16];
  int ny;
  int nx;
  uint64_t bIn;
  uint64_t bpl;
  uint64_t nBytes;
  uint64_t n;
  uint16_t *row3;
  uint16_t *row2;
  uint16_t *row1;
  uint16_t *row0;
  uint8_t *tmp;
  uint8_t *scratch;
  uint8_t *out;
  uint8_t *in;
  size_t local_f0;
  int local_dc;
  int local_d4;
  int local_d0;
  int local_cc;
  int local_bc;
  uint16_t local_b8 [4];
  undefined1 auStack_b0 [8];
  undefined1 auStack_a8 [8];
  undefined1 auStack_a0 [8];
  int local_98;
  int local_94;
  long local_90;
  size_t local_88;
  size_t local_80;
  size_t local_78;
  void *local_70;
  void *local_68;
  void *local_60;
  void *local_58;
  void *local_50;
  void *local_48;
  void *local_40;
  uint8_t *local_38;
  ulong local_30;
  ulong local_20;
  long *local_10;
  
  local_48 = (void *)in_RDI[0x14];
  local_88 = 0;
  local_90 = 0;
  local_40 = in_RCX;
  local_38 = in_RSI;
  local_30 = in_R8;
  local_20 = in_RDX;
  local_10 = in_RDI;
  for (local_bc = 0; local_bc < (short)local_10[1]; local_bc = local_bc + 1) {
    lVar2 = *local_10 + (long)local_bc * 0x30;
    local_94 = *(int *)(lVar2 + 0xc);
    local_98 = *(int *)(lVar2 + 8);
    local_80 = (long)local_98 * (long)local_94 * (long)*(char *)(lVar2 + 0x19);
    if (local_80 != 0) {
      if (*(short *)(lVar2 + 0x1a) == 1) {
        for (local_cc = 0; local_cc < local_98; local_cc = local_cc + 4) {
          local_58 = (void *)((long)local_48 + (long)(local_cc * local_94) * 2);
          local_60 = (void *)((long)local_58 + (long)local_94 * 2);
          local_68 = (void *)((long)local_60 + (long)local_94 * 2);
          local_70 = (void *)((long)local_68 + (long)local_94 * 2);
          for (local_d0 = 0; local_d0 < local_94; local_d0 = local_d0 + 4) {
            if (local_20 < local_90 + 3U) {
              return 1;
            }
            if (local_38[2] < 0x34) {
              if (local_20 < local_90 + 0xeU) {
                return 1;
              }
              unpack14(local_38,local_b8);
              local_38 = local_38 + 0xe;
              local_90 = local_90 + 0xe;
            }
            else {
              unpack3(local_38,local_b8);
              local_38 = local_38 + 3;
              local_90 = local_90 + 3;
            }
            if (*(char *)(lVar2 + 0x18) != '\0') {
              convertToLinear(local_b8);
            }
            priv_from_native16(local_b8,0x10);
            if (local_d0 + 3 < local_94) {
              local_f0 = 8;
            }
            else {
              local_f0 = (long)(local_94 - local_d0) << 1;
            }
            local_78 = local_f0;
            if (local_cc + 3 < local_98) {
              memcpy(local_58,local_b8,local_f0);
              memcpy(local_60,auStack_b0,local_78);
              memcpy(local_68,auStack_a8,local_78);
              memcpy(local_70,auStack_a0,local_78);
            }
            else {
              memcpy(local_58,local_b8,local_f0);
              if (local_cc + 1 < local_98) {
                memcpy(local_60,auStack_b0,local_78);
              }
              if (local_cc + 2 < local_98) {
                memcpy(local_68,auStack_a8,local_78);
              }
            }
            local_58 = (void *)((long)local_58 + 8);
            local_60 = (void *)((long)local_60 + 8);
            local_68 = (void *)((long)local_68 + 8);
            local_70 = (void *)((long)local_70 + 8);
          }
        }
        local_48 = (void *)(local_80 + (long)local_48);
      }
      else {
        if (local_20 < local_90 + local_80) {
          return 1;
        }
        memcpy(local_48,local_38,local_80);
        local_38 = local_38 + local_80;
        local_90 = local_80 + local_90;
        local_48 = (void *)(local_80 + (long)local_48);
      }
    }
  }
  local_90 = 0;
  local_d4 = 0;
  do {
    if (*(int *)((long)local_10 + 0x24) <= local_d4) {
      return 0;
    }
    lVar2 = local_10[4];
    local_48 = (void *)local_10[0x14];
    for (local_dc = 0; local_dc < (short)local_10[1]; local_dc = local_dc + 1) {
      lVar3 = *local_10 + (long)local_dc * 0x30;
      local_94 = *(int *)(lVar3 + 0xc);
      local_98 = *(int *)(lVar3 + 8);
      local_88 = (long)local_94 * (long)*(char *)(lVar3 + 0x19);
      local_80 = (long)local_98 * local_88;
      if (local_80 != 0) {
        iVar1 = local_d4;
        if (1 < *(int *)(lVar3 + 0x14)) {
          if ((local_d4 + (int)lVar2) % *(int *)(lVar3 + 0x14) != 0) {
            local_48 = (void *)(local_80 + (long)local_48);
            goto LAB_00108855;
          }
          iVar1 = local_d4 / *(int *)(lVar3 + 0x14);
        }
        local_50 = (void *)((long)iVar1 * local_88 + (long)local_48);
        if (local_30 < local_90 + local_88) {
          return 1;
        }
        memcpy(local_40,local_50,local_88);
        local_90 = local_88 + local_90;
        local_40 = (void *)(local_88 + (long)local_40);
        local_48 = (void *)(local_80 + (long)local_48);
      }
LAB_00108855:
    }
    local_d4 = local_d4 + 1;
  } while( true );
}

Assistant:

static exr_result_t
uncompress_b44_impl (
    exr_decode_pipeline_t* decode,
    const void*            compressed_data,
    uint64_t               comp_buf_size,
    void*                  uncompressed_data,
    uint64_t               uncomp_buf_size)
{
    const uint8_t* in      = (const uint8_t*) compressed_data;
    uint8_t*       out     = (uint8_t*) uncompressed_data;
    uint8_t*       scratch = (uint8_t*) decode->scratch_buffer_1;
    uint8_t*       tmp;
    uint16_t *     row0, *row1, *row2, *row3;
    uint64_t       n, nBytes, bpl = 0, bIn = 0;
    int            nx, ny;
    uint16_t       s[16];

    for (int c = 0; c < decode->channel_count; ++c)
    {
        const exr_coding_channel_info_t* curc = decode->channels + c;
        nx                                    = curc->width;
        ny                                    = curc->height;
        nBytes = (uint64_t) (ny) * (uint64_t) (nx) *
                 (uint64_t) (curc->bytes_per_element);

        if (nBytes == 0) continue;

        if (curc->data_type != EXR_PIXEL_HALF)
        {
            if (bIn + nBytes > comp_buf_size) return EXR_ERR_OUT_OF_MEMORY;
            memcpy (scratch, in, nBytes);
            in += nBytes;
            bIn += nBytes;
            scratch += nBytes;
            continue;
        }

        for (int y = 0; y < ny; y += 4)
        {
            row0 = (uint16_t*) scratch;
            row0 += y * nx;
            row1 = row0 + nx;
            row2 = row1 + nx;
            row3 = row2 + nx;
            for (int x = 0; x < nx; x += 4)
            {
                if (bIn + 3 > comp_buf_size) return EXR_ERR_OUT_OF_MEMORY;

                /* check if 3-byte encoded flat field */
                if (in[2] >= (13 << 2))
                {
                    unpack3 (in, s);
                    in += 3;
                    bIn += 3;
                }
                else
                {
                    if (bIn + 14 > comp_buf_size) return EXR_ERR_OUT_OF_MEMORY;
                    unpack14 (in, s);
                    in += 14;
                    bIn += 14;
                }

                if (curc->p_linear) convertToLinear (s);

                priv_from_native16 (s, 16);

                n = (x + 3 < nx) ? 4 * sizeof (uint16_t)
                                 : (uint64_t) (nx - x) * sizeof (uint16_t);
                if (y + 3 < ny)
                {
                    memcpy (row0, &s[0], n);
                    memcpy (row1, &s[4], n);
                    memcpy (row2, &s[8], n);
                    memcpy (row3, &s[12], n);
                }
                else
                {
                    memcpy (row0, &s[0], n);
                    if (y + 1 < ny) memcpy (row1, &s[4], n);
                    if (y + 2 < ny) memcpy (row2, &s[8], n);
                }
                row0 += 4;
                row1 += 4;
                row2 += 4;
                row3 += 4;
            }
        }
        scratch += nBytes;
    }

    /* now put it back so each scanline has channel data */
    bIn = 0;
    for (int y = 0; y < decode->chunk.height; ++y)
    {
        int cury = y + decode->chunk.start_y;

        scratch = (uint8_t*) decode->scratch_buffer_1;
        for (int c = 0; c < decode->channel_count; ++c)
        {
            const exr_coding_channel_info_t* curc = decode->channels + c;

            nx     = curc->width;
            ny     = curc->height;
            bpl    = ((uint64_t) (nx)) * (uint64_t) (curc->bytes_per_element);
            nBytes = ((uint64_t) (ny)) * bpl;

            if (nBytes == 0) continue;

            tmp = scratch;
            if (curc->y_samples > 1)
            {
                if ((cury % curc->y_samples) != 0)
                {
                    scratch += nBytes;
                    continue;
                }
                tmp += ((uint64_t) (y / curc->y_samples)) * bpl;
            }
            else
                tmp += ((uint64_t) y) * bpl;

            if (bIn + bpl > uncomp_buf_size) return EXR_ERR_OUT_OF_MEMORY;

            memcpy (out, tmp, bpl);

            bIn += bpl;
            out += bpl;
            scratch += nBytes;
        }
    }

    return EXR_ERR_SUCCESS;
}